

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scratch_impl.h
# Opt level: O3

int secp256k1_scratch_allocate_frame(secp256k1_scratch *scratch,size_t n,size_t objects)

{
  size_t sVar1;
  secp256k1_callback *psVar2;
  long lVar3;
  ulong uVar4;
  void *pvVar5;
  size_t sVar6;
  ulong uVar7;
  int iVar8;
  size_t __size;
  
  sVar1 = scratch->frame;
  lVar3 = 0;
  if (sVar1 != 0) {
    sVar6 = 0;
    do {
      lVar3 = lVar3 + scratch->frame_size[sVar6];
      sVar6 = sVar6 + 1;
    } while (sVar1 != sVar6);
  }
  uVar7 = scratch->max_size - lVar3;
  uVar4 = 0;
  if (objects * 0x10 <= uVar7) {
    uVar4 = uVar7 + objects * -0x10;
  }
  iVar8 = 0;
  if (n <= uVar4) {
    __size = objects * 0x10 + n;
    psVar2 = scratch->error_callback;
    pvVar5 = malloc(__size);
    if (pvVar5 == (void *)0x0) {
      (*psVar2->fn)("Out of memory",psVar2->data);
      scratch->data[scratch->frame] = (void *)0x0;
      iVar8 = 0;
    }
    else {
      scratch->data[sVar1] = pvVar5;
      scratch->frame_size[sVar1] = __size;
      scratch->offset[scratch->frame] = 0;
      scratch->frame = scratch->frame + 1;
      iVar8 = 1;
    }
  }
  return iVar8;
}

Assistant:

static int secp256k1_scratch_allocate_frame(secp256k1_scratch* scratch, size_t n, size_t objects) {
    VERIFY_CHECK(scratch->frame < SECP256K1_SCRATCH_MAX_FRAMES);

    if (n <= secp256k1_scratch_max_allocation(scratch, objects)) {
        n += objects * ALIGNMENT;
        scratch->data[scratch->frame] = checked_malloc(scratch->error_callback, n);
        if (scratch->data[scratch->frame] == NULL) {
            return 0;
        }
        scratch->frame_size[scratch->frame] = n;
        scratch->offset[scratch->frame] = 0;
        scratch->frame++;
        return 1;
    } else {
        return 0;
    }
}